

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGlitch.c
# Opt level: O1

uint Gli_ManSimulateSeqNode(Gli_Man_t *p,Gli_Obj_t *pNode)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint pSimInfos [6];
  uint local_28 [6];
  
  uVar5 = *(uint *)pNode >> 4 & 7;
  if (uVar5 != 7) {
    if (uVar5 != 0) {
      uVar2 = 0;
      do {
        local_28[uVar2] = *(uint *)((long)pNode + (long)(int)pNode[1].uTruth[uVar2 - 2] * -4 + 0x10)
        ;
        uVar2 = uVar2 + 1;
      } while (uVar5 != uVar2);
    }
    uVar1 = 0;
    iVar3 = 0;
    do {
      uVar6 = 0;
      if (uVar5 != 0) {
        uVar2 = 0;
        uVar6 = 0;
        do {
          uVar4 = 1 << ((byte)uVar2 & 0x1f);
          if ((local_28[uVar2] & 1 << ((byte)iVar3 & 0x1f)) == 0) {
            uVar4 = 0;
          }
          uVar6 = uVar6 | uVar4;
          uVar2 = uVar2 + 1;
        } while (uVar5 != uVar2);
      }
      uVar4 = 1 << ((byte)iVar3 & 0x1f);
      if ((pNode->uTruth[(int)uVar6 >> 5] >> (uVar6 & 0x1f) & 1) == 0) {
        uVar4 = 0;
      }
      uVar1 = uVar1 | uVar4;
      iVar3 = iVar3 + 1;
    } while (iVar3 != 0x20);
    return uVar1;
  }
  __assert_fail("nFanins <= 6",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaGlitch.c"
                ,0x24b,"unsigned int Gli_ManSimulateSeqNode(Gli_Man_t *, Gli_Obj_t *)");
}

Assistant:

unsigned Gli_ManSimulateSeqNode( Gli_Man_t * p, Gli_Obj_t * pNode )
{
    unsigned pSimInfos[6], Result = 0;
    int nFanins = Gli_ObjFaninNum(pNode);
    int i, k, Phase;
    Gli_Obj_t * pFanin;
    assert( nFanins <= 6 );
    Gli_ObjForEachFanin( pNode, pFanin, i )
        pSimInfos[i] = pFanin->uSimInfo;
    for ( i = 0; i < 32; i++ )
    {
        Phase = 0;
        for ( k = 0; k < nFanins; k++ )
            if ( (pSimInfos[k] >> i) & 1 )
                Phase |= (1 << k);
        if ( Abc_InfoHasBit( pNode->uTruth, Phase ) )
            Result |= (1 << i);
    }
    return Result;
}